

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum_Base.h
# Opt level: O0

void Hacl_Bignum_Convert_bn_to_bytes_be_uint64(uint32_t len,uint64_t *b,uint8_t *res)

{
  long lVar1;
  uint8_t *puVar2;
  __uint64_t _Var3;
  ulong uVar4;
  undefined1 *__src;
  undefined8 uStack_60;
  undefined1 auStack_58 [8];
  uint8_t *local_50;
  undefined1 *local_48;
  uint local_3c;
  ulong uStack_38;
  uint32_t i;
  unsigned_long __vla_expr0;
  uint local_28;
  uint local_24;
  uint32_t tmpLen;
  uint32_t bnLen;
  uint8_t *res_local;
  uint64_t *b_local;
  uint32_t len_local;
  
  __vla_expr0 = (unsigned_long)auStack_58;
  local_24 = (len - 1 >> 3) + 1;
  local_28 = local_24 * 8;
  uStack_38 = (ulong)local_28;
  lVar1 = -(uStack_38 + 0xf & 0xfffffffffffffff0);
  uVar4 = (ulong)local_28;
  local_48 = auStack_58 + lVar1;
  _tmpLen = res;
  res_local = (uint8_t *)b;
  b_local._4_4_ = len;
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x270320;
  memset(auStack_58 + lVar1,0,uVar4);
  for (local_3c = 0; puVar2 = _tmpLen, local_3c < local_24; local_3c = local_3c + 1) {
    local_50 = local_48 + (local_3c << 3);
    _Var3 = *(__uint64_t *)(res_local + (ulong)((local_24 - local_3c) - 1) * 8);
    *(undefined8 *)((long)&uStack_60 + lVar1) = 0x27035a;
    _Var3 = __bswap_64(_Var3);
    puVar2 = local_50;
    *(undefined8 *)((long)&uStack_60 + lVar1) = 0x270366;
    store64(puVar2,_Var3);
  }
  __src = local_48 + ((ulong)local_28 - (ulong)b_local._4_4_);
  uVar4 = (ulong)b_local._4_4_;
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x27039a;
  memcpy(puVar2,__src,uVar4);
  return;
}

Assistant:

static inline void
Hacl_Bignum_Convert_bn_to_bytes_be_uint64(uint32_t len, uint64_t *b, uint8_t *res)
{
  uint32_t bnLen = (len - 1U) / 8U + 1U;
  uint32_t tmpLen = 8U * bnLen;
  KRML_CHECK_SIZE(sizeof (uint8_t), tmpLen);
  uint8_t tmp[tmpLen];
  memset(tmp, 0U, tmpLen * sizeof (uint8_t));
  for (uint32_t i = 0U; i < bnLen; i++)
  {
    store64_be(tmp + i * 8U, b[bnLen - i - 1U]);
  }
  memcpy(res, tmp + tmpLen - len, len * sizeof (uint8_t));
}